

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTreeEdge.cpp
# Opt level: O0

bool __thiscall PhyloTreeEdge::sameBipartition(PhyloTreeEdge *this,Bipartition *bip)

{
  bool bVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a;
  long in_RDI;
  Bipartition *in_stack_ffffffffffffffa8;
  
  a = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8);
  Bipartition::getPartition(in_stack_ffffffffffffffa8);
  bVar1 = boost::operator==(a,(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_ffffffffffffffa8);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(a);
  return bVar1;
}

Assistant:

bool PhyloTreeEdge::sameBipartition(const Bipartition &bip) const {
    return partition == bip.getPartition();
}